

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_stress_test.cpp
# Opt level: O2

void __thiscall
density_tests::allocator_stress_test::Impl::run(Impl *this,ThreadData *i_data,uint64_t i_cpu_index)

{
  mutex *__mutex;
  bool bVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  void *pvVar5;
  bool bVar6;
  size_t index;
  long lVar7;
  undefined1 auVar8 [16];
  basic_default_allocator<65536UL> local_1431;
  void *new_page;
  page_warehouse warehouse;
  microseconds wait_duration;
  EasyRandom rand;
  
  set_thread_affinity(1L << ((byte)i_cpu_index & 0x3f));
  set_thread_priority(critical);
  EasyRandom::EasyRandom(&rand);
  warehouse.m_timeout.__r = (this->m_config).m_allocation_timeout.__r * 1000;
  warehouse.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  warehouse.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  warehouse.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  warehouse.m_max_pages = (this->m_config).m_max_memory_per_cpu / 0xfff0;
  __mutex = &(this->m_started_threads).m_mutex;
  std::mutex::lock(__mutex);
  (this->m_started_threads).m_counter = (this->m_started_threads).m_counter + 1;
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  bVar6 = false;
  do {
    if (((this->m_should_exit)._M_base._M_i & 1U) != 0) {
      anon_unknown_5::page_warehouse::~page_warehouse(&warehouse);
      return;
    }
    wait_duration =
         random_duration(&rand,(this->m_config).m_min_wait.__r,(this->m_config).m_max_wait.__r);
    Statistics::sample(&i_data->m_inactivity_time,(double)wait_duration.__r * 1e-06);
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&wait_duration);
    lVar2 = std::chrono::_V2::steady_clock::now();
    if (bVar6) {
      lVar3 = ((ulong)((long)warehouse.m_allocated_pages.
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)warehouse.m_allocated_pages.
                            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3) * 0xfff0;
      auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar8._0_8_ = lVar3;
      auVar8._12_4_ = 0x45300000;
      Statistics::sample(&i_data->m_used_memory,
                         ((auVar8._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) *
                         9.5367431640625e-07);
      anon_unknown_5::page_warehouse::deallocation_loop(&warehouse);
    }
    else {
      lVar3 = std::chrono::_V2::steady_clock::now();
      bVar1 = false;
      while( true ) {
        if (bVar1) {
          pvVar4 = density::basic_default_allocator<65536UL>::try_allocate_page
                             (&local_1431,progress_blocking);
        }
        else {
          pvVar4 = density::basic_default_allocator<65536UL>::try_allocate_page_zeroed
                             (&local_1431,progress_blocking);
        }
        new_page = pvVar4;
        if (pvVar4 == (void *)0x0) break;
        pvVar5 = pvVar4;
        for (lVar7 = 0; lVar7 != 0x1ffe; lVar7 = lVar7 + 1) {
          if ((!bVar1) && (*(long *)((long)pvVar4 + lVar7 * 8) != 0)) {
            detail::assert_failed<>
                      ("words[index] == 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/test_framework/allocator_stress_test.cpp"
                       ,0x5a);
            pvVar5 = new_page;
          }
          *(void **)((long)pvVar4 + lVar7 * 8) = pvVar5;
        }
        std::vector<void_*,_std::allocator<void_*>_>::push_back
                  (&warehouse.m_allocated_pages,&new_page);
        lVar7 = std::chrono::_V2::steady_clock::now();
        if ((warehouse.m_timeout.__r <= lVar7 - lVar3) ||
           (bVar1 = (bool)(bVar1 ^ 1),
           warehouse.m_max_pages <=
           (ulong)((long)warehouse.m_allocated_pages.
                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)warehouse.m_allocated_pages.
                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3))) break;
      }
    }
    bVar6 = (bool)(bVar6 ^ 1);
    lVar3 = std::chrono::_V2::steady_clock::now();
    Statistics::sample(&i_data->m_activity_time,(double)(lVar3 - lVar2) * 1e-09);
  } while( true );
}

Assistant:

void run(ThreadData & i_data, uint64_t i_cpu_index)
        {
            set_thread_affinity(uint64_t(1) << i_cpu_index);
            set_thread_priority(thread_priority::critical);
            EasyRandom rand;

            page_warehouse warehouse(m_config.m_max_memory_per_cpu, m_config.m_allocation_timeout);

            m_started_threads.increment();

            auto micro_to_seconds = [](std::chrono::microseconds i_microseconds) {
                double const mult = 1. / (1000. * 1000.);
                return static_cast<double>(i_microseconds.count()) * mult;
            };

            auto nano_to_seconds = [](std::chrono::nanoseconds i_nanoseconds) {
                double const mult = 1. / (1000. * 1000. * 1000.);
                return static_cast<double>(i_nanoseconds.count()) * mult;
            };

            bool should_allocate = false;
            while (!m_should_exit.load())
            {
                auto const wait_duration =
                  random_duration(rand, m_config.m_min_wait, m_config.m_max_wait);

                i_data.m_inactivity_time.sample(micro_to_seconds(wait_duration));

                std::this_thread::sleep_for(wait_duration);

                auto const activity_start = std::chrono::steady_clock::now();

                should_allocate = !should_allocate;
                if (should_allocate)
                {
                    warehouse.allocation_loop();
                }
                else
                {
                    double const bytes_to_mb = 1. / (1024. * 1024.);
                    i_data.m_used_memory.sample(warehouse.allocated_memory() * bytes_to_mb);
                    warehouse.deallocation_loop();
                }

                auto const activity_duration = std::chrono::steady_clock::now() - activity_start;

                i_data.m_activity_time.sample(nano_to_seconds(activity_duration));
            }
        }